

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::makeMove(Fifteen *this,Move move,size_t row,size_t col)

{
  BoardMode BVar1;
  code *UNRECOVERED_JUMPTABLE;
  size_t sVar2;
  size_t sVar3;
  
  BVar1 = Controller::getBoardMode
                    ((this->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  if (BVar1 == NUMERIC) {
    UNRECOVERED_JUMPTABLE = moveNumericTile;
  }
  else {
    UNRECOVERED_JUMPTABLE = moveGraphicTile;
  }
  sVar2 = row;
  sVar3 = col;
  switch(move) {
  case UP:
    sVar2 = row - 1;
    break;
  case RIGHT:
    sVar3 = col + 1;
    break;
  case DOWN:
    sVar2 = row + 1;
    break;
  case LEFT:
    sVar3 = col - 1;
    break;
  default:
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(this,row,col,sVar2,sVar3);
  return;
}

Assistant:

void Fifteen::makeMove( Move move, size_t row, size_t col )
{
    auto moveTile = ( controller->getBoardMode() == BoardMode::NUMERIC ) ? &Fifteen::moveNumericTile :
                                                                           &Fifteen::moveGraphicTile;
    switch ( move )
    {
        case Move::UP:
            ( this->*moveTile )( row, col, row - 1, col );
            return;
        case Move::RIGHT:
            ( this->*moveTile )( row, col, row, col + 1 );
            return;
        case Move::DOWN:
            ( this->*moveTile )( row, col, row + 1, col );
            return;
        case Move::LEFT:
            ( this->*moveTile )( row, col, row, col - 1 );
            return;
    }
}